

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O0

short __thiscall
libdivide::divider<short,_(libdivide::Branching)0>::recover
          (divider<short,_(libdivide::Branching)0> *this)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  bool bVar4;
  divider<short,_(libdivide::Branching)0> *this_local;
  int16_t result;
  uint16_t q;
  uint32_t n;
  uint16_t d;
  int16_t result_1;
  int magic_was_negated;
  int negative_divisor;
  uint16_t absD;
  uint8_t shift;
  uint8_t more;
  uint16_t local_2;
  
  bVar1 = (this->div).denom.more;
  bVar3 = bVar1 & 0x1f;
  if ((this->div).denom.magic == 0) {
    absD = (uint16_t)(1 << bVar3);
    if ((bVar1 & 0x80) != 0) {
      absD = -absD;
    }
    local_2 = absD;
  }
  else {
    if ((bVar1 & 0x40) == 0) {
      bVar4 = (this->div).denom.magic < 0;
    }
    else {
      bVar4 = 0 < (this->div).denom.magic;
    }
    if ((this->div).denom.magic == 0) {
      local_2 = (uint16_t)(1 << bVar3);
      if ((bVar1 & 0x80) != 0) {
        local_2 = -local_2;
      }
    }
    else {
      if (bVar4) {
        uVar2 = -(this->div).denom.magic;
      }
      else {
        uVar2 = (this->div).denom.magic;
      }
      local_2 = (short)((uint)(1 << (bVar3 + 0x10 & 0x1f)) / (uint)uVar2) + 1;
      if ((bVar1 & 0x80) != 0) {
        local_2 = -local_2;
      }
    }
  }
  return local_2;
}

Assistant:

T recover() const { return div.recover(); }